

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

ENetListIterator enet_list_move(ENetListIterator position,void *dataFirst,void *dataLast)

{
  long lVar1;
  long *plVar2;
  _ENetListNode *p_Var3;
  ENetListIterator first;
  
  lVar1 = *dataLast;
  plVar2 = *(long **)((long)dataFirst + 8);
  *plVar2 = lVar1;
  *(long **)(lVar1 + 8) = plVar2;
  p_Var3 = position->previous;
  *(_ENetListNode **)((long)dataFirst + 8) = p_Var3;
  *(ENetListIterator *)dataLast = position;
  p_Var3->next = (_ENetListNode *)dataFirst;
  position->previous = (_ENetListNode *)dataLast;
  return (ENetListIterator)dataFirst;
}

Assistant:

ENetListIterator enet_list_move(ENetListIterator position, void* dataFirst, void* dataLast) {
	ENetListIterator first = (ENetListIterator)dataFirst;
	ENetListIterator last = (ENetListIterator)dataLast;
	first->previous->next = last->next;
	last->next->previous = first->previous;
	first->previous = position->previous;
	last->next = position;
	first->previous->next = first;
	position->previous = last;

	return first;
}